

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::inf_or_nan_writer>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
           *this,align_spec *spec,inf_or_nan_writer *f)

{
  wchar_t wVar1;
  alignment aVar2;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *this_00;
  unsigned_long __n;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  inf_or_nan_writer *in_RDX;
  align_spec *in_RSI;
  size_t left_padding;
  size_t padding;
  char_type fill;
  type *it;
  size_t num_code_points;
  size_t size;
  uint width;
  wchar_t **in_stack_ffffffffffffff88;
  wchar_t *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  type local_48;
  type *local_40;
  type local_38;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *local_30;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *local_28;
  uint local_1c;
  inf_or_nan_writer *local_18;
  align_spec *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_1c = align_spec::width(in_RSI);
  this_00 = (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
             *)basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
               ::inf_or_nan_writer::size(local_18);
  local_28 = this_00;
  if (local_1c != 0) {
    this_00 = (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
               *)basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                 ::inf_or_nan_writer::width((inf_or_nan_writer *)0x24b32b);
  }
  local_30 = this_00;
  if (this_00 < (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                 *)(ulong)local_1c) {
    local_48 = basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
               ::reserve(this_00,(size_t)in_stack_ffffffffffffff88);
    local_40 = &local_48;
    wVar1 = align_spec::fill(local_10);
    __n = (ulong)local_1c - (long)local_30;
    aVar2 = align_spec::align(local_10);
    if (aVar2 == ALIGN_RIGHT) {
      pwVar3 = std::fill_n<wchar_t*,unsigned_long,wchar_t>
                         ((wchar_t *)CONCAT44(wVar1,in_stack_ffffffffffffffb0),__n,
                          in_stack_ffffffffffffffa0);
      *local_40 = pwVar3;
      inf_or_nan_writer::operator()((inf_or_nan_writer *)this_00,in_stack_ffffffffffffff88);
    }
    else {
      aVar2 = align_spec::align(local_10);
      if (aVar2 == ALIGN_CENTER) {
        pwVar3 = (wchar_t *)(__n >> 1);
        pwVar4 = std::fill_n<wchar_t*,unsigned_long,wchar_t>
                           ((wchar_t *)CONCAT44(wVar1,in_stack_ffffffffffffffb0),__n,pwVar3);
        *local_40 = pwVar4;
        inf_or_nan_writer::operator()((inf_or_nan_writer *)this_00,in_stack_ffffffffffffff88);
        pwVar3 = std::fill_n<wchar_t*,unsigned_long,wchar_t>
                           ((wchar_t *)CONCAT44(wVar1,in_stack_ffffffffffffffb0),__n,pwVar3);
        *local_40 = pwVar3;
      }
      else {
        inf_or_nan_writer::operator()((inf_or_nan_writer *)this_00,in_stack_ffffffffffffff88);
        pwVar3 = std::fill_n<wchar_t*,unsigned_long,wchar_t>
                           ((wchar_t *)CONCAT44(wVar1,in_stack_ffffffffffffffb0),__n,
                            in_stack_ffffffffffffffa0);
        *local_40 = pwVar3;
      }
    }
  }
  else {
    local_38 = basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
               ::reserve(this_00,(size_t)local_18);
    inf_or_nan_writer::operator()((inf_or_nan_writer *)this_00,(wchar_t **)local_18);
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }